

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

JSONNode __thiscall JSONNode::dump(JSONNode *this,size_t *totalmemory)

{
  size_t sVar1;
  undefined1 local_c0 [16];
  json_string local_b0;
  JSONNode local_90;
  allocator local_81;
  json_string local_80;
  JSONNode local_60;
  undefined1 local_55;
  allocator local_41;
  json_string local_40;
  size_t *totalmemory_local;
  JSONNode *this_local;
  JSONNode *dumpage;
  
  sVar1 = *totalmemory;
  totalmemory_local = totalmemory;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(sVar1 != 0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_55 = 0;
  JSONNode(this,'\x05');
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"this",&local_81);
  JSONNode(&local_60,&local_80,(long)totalmemory);
  push_back(this,&local_60);
  ~JSONNode(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"bytes used",(allocator *)(local_c0 + 0xf));
  JSONNode(&local_90,&local_b0,8);
  push_back(this,&local_90);
  ~JSONNode(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0xf));
  internalJSONNode::Dump((internalJSONNode *)local_c0,(size_t *)*totalmemory);
  push_back(this,(JSONNode *)local_c0);
  ~JSONNode((JSONNode *)local_c0);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

inline JSONNode JSONNode::dump(size_t & totalmemory) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSONNode dumpage(JSON_NODE);
		  dumpage.push_back(JSON_NEW(JSONNode(JSON_TEXT("this"), (long)this)));
		  dumpage.push_back(JSON_NEW(JSONNode(JSON_TEXT("bytes used"), sizeof(JSONNode))));
		  dumpage.push_back(JSON_NEW(internal -> Dump(totalmemory)));
		  return dumpage;
	   }